

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

uint prvTidygetNextStringKey(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  uint uVar3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var4 = *iter;
    uVar3 = 0;
    if (p_Var4 == (TidyIterator)0x0) {
      p_Var4 = (TidyIterator)0x0;
    }
    else {
      uVar1 = tidyStringKeyListSize();
      uVar3 = 0;
      if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
        uVar3 = *(uint *)&language_fr.messages[(long)((long)&p_Var4[0x95]._opaque + 3)].value;
        p_Var4 = (TidyIterator)((long)&p_Var4->_opaque + 1);
      }
    }
    uVar1 = tidyStringKeyListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var4;
    }
    *iter = p_Var2;
    return uVar3;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]libtidy/src/language.c"
                ,0x20e,"uint prvTidygetNextStringKey(TidyIterator *)");
}

Assistant:

uint TY_(getNextStringKey)( TidyIterator* iter )
{
    uint item = 0;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyStringKeyListSize() )
    {
        item = language_en.messages[ itemIndex - 1 ].key;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyStringKeyListSize() ? itemIndex : (size_t)0 );
    return item;
}